

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O0

pair<unsigned_int,_const_char_*> parse_char(char *src)

{
  runtime_error *prVar1;
  char *in_RDI;
  pair<char,_const_char_*> pVar2;
  pair<unsigned_int,_const_char_*> pVar3;
  char **in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffff20;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  string local_b0 [32];
  char *local_90;
  pair<char,_const_char_*> local_88;
  char *local_78;
  undefined1 local_69;
  pair<char,_const_char_*> local_68;
  undefined8 in_stack_ffffffffffffffa8;
  int size;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  pair<char,_const_char_*> local_48;
  char *local_38;
  undefined1 local_29;
  pair<char,_const_char_*> local_28;
  pair<unsigned_int,_const_char_*> local_10;
  
  if (*in_RDI == '\\') {
    size = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    switch(in_RDI[1]) {
    case '\"':
    case '[':
    case '\\':
    case ']':
      local_90 = in_RDI + 2;
      pVar2 = std::make_pair<char_const&,char_const*>
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_88.second = pVar2.second;
      local_88.first = pVar2.first;
      std::pair<unsigned_int,_const_char_*>::pair<char,_const_char_*,_true>(&local_10,&local_88);
      break;
    default:
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffff2f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::operator+(__lhs,(char *)prVar1);
      std::runtime_error::runtime_error(prVar1,local_b0);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 'U':
      pVar3 = parse_hex((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),size);
      local_10.second = pVar3.second;
      local_10.first = pVar3.first;
      break;
    case 'n':
      local_69 = 10;
      local_78 = in_RDI + 2;
      pVar2 = std::make_pair<char,char_const*>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_68.second = pVar2.second;
      local_68.first = pVar2.first;
      std::pair<unsigned_int,_const_char_*>::pair<char,_const_char_*,_true>(&local_10,&local_68);
      break;
    case 'r':
      pVar2 = std::make_pair<char,char_const*>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_48.second = pVar2.second;
      local_48.first = pVar2.first;
      std::pair<unsigned_int,_const_char_*>::pair<char,_const_char_*,_true>(&local_10,&local_48);
      break;
    case 't':
      local_29 = 9;
      local_38 = in_RDI + 2;
      pVar2 = std::make_pair<char,char_const*>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_28.second = pVar2.second;
      local_28.first = pVar2.first;
      std::pair<unsigned_int,_const_char_*>::pair<char,_const_char_*,_true>(&local_10,&local_28);
      break;
    case 'u':
      pVar3 = parse_hex((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),size);
      local_10.second = pVar3.second;
      local_10.first = pVar3.first;
      break;
    case 'x':
      pVar3 = parse_hex((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),size);
      local_10.second = pVar3.second;
      local_10.first = pVar3.first;
    }
  }
  else {
    if (*in_RDI == '\0') {
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,"unexpected end of input");
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar3 = decode_utf8(in_stack_ffffffffffffff20);
    local_10.second = pVar3.second;
    local_10.first = pVar3.first;
  }
  pVar3._4_4_ = 0;
  pVar3.first = local_10.first;
  pVar3.second = local_10.second;
  return pVar3;
}

Assistant:

static std::pair<uint32_t, const char *> parse_char(const char * src) {
    if (*src == '\\') {
        switch (src[1]) {
            case 'x': return parse_hex(src + 2, 2);
            case 'u': return parse_hex(src + 2, 4);
            case 'U': return parse_hex(src + 2, 8);
            case 't': return std::make_pair('\t', src + 2);
            case 'r': return std::make_pair('\r', src + 2);
            case 'n': return std::make_pair('\n', src + 2);
            case '\\':
            case '"':
            case '[':
            case ']':
                      return std::make_pair(src[1], src + 2);
            default:
                      throw std::runtime_error(std::string("unknown escape at ") + src);
        }
    } else if (*src) {
        return decode_utf8(src);
    }
    throw std::runtime_error("unexpected end of input");
}